

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

char * __thiscall Doublet::index(Doublet *this,char *__s,int __c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = GaussianOrder(&(this->left).ijk);
  iVar2 = Gaussian::ncart(&this->right);
  iVar3 = GaussianOrder(&(this->right).ijk);
  return (char *)(ulong)(uint)(iVar3 + iVar2 * iVar1);
}

Assistant:

int index(void) const { return left.index() * right.ncart() + right.index(); }